

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

int GetProcessorCount(void)

{
  __pid_t __pid;
  int iVar1;
  long lVar2;
  cpu_set_t set;
  
  __pid = getpid();
  iVar1 = sched_getaffinity(__pid,0x80,(cpu_set_t *)&set);
  if (iVar1 == 0) {
    iVar1 = __sched_cpucount(0x80,(cpu_set_t *)&set);
  }
  else {
    lVar2 = sysconf(0x54);
    iVar1 = (int)lVar2;
  }
  return iVar1;
}

Assistant:

int GetProcessorCount() {
#ifdef _WIN32
  return GetActiveProcessorCount(ALL_PROCESSOR_GROUPS);
#else
#ifdef CPU_COUNT
  // The number of exposed processors might not represent the actual number of
  // processors threads can run on. This happens when a CPU set limitation is
  // active, see https://github.com/ninja-build/ninja/issues/1278
  cpu_set_t set;
  if (sched_getaffinity(getpid(), sizeof(set), &set) == 0) {
    return CPU_COUNT(&set);
  }
#endif
  return sysconf(_SC_NPROCESSORS_ONLN);
#endif
}